

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O3

int free_fields(size_t n_fields,char ***fields)

{
  char **__ptr;
  int iVar1;
  size_t sVar2;
  
  iVar1 = 1;
  if ((fields != (char ***)0x0 && n_fields != 0) &&
     (__ptr = *fields, iVar1 = 1, __ptr != (char **)0x0)) {
    sVar2 = 0;
    do {
      if (__ptr[sVar2] != (char *)0x0) {
        free(__ptr[sVar2]);
      }
      sVar2 = sVar2 + 1;
    } while (n_fields != sVar2);
    free(__ptr);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int 
free_fields(size_t n_fields, char*** fields) 
{
	size_t ind;
	char** work;
	
	if ((n_fields == 0) || (! fields) || (! *fields)) {
		return 1;
	}
	
	work = *fields;
	
	for (ind = 0; ind < n_fields; ind++) {
		if (! work[ind]) {
			continue;
		}
		free(work[ind]);
	}
	
	free(work);
	
	return 0;
}